

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O3

ZyanStatus
ZydisDecodeVEX(ZydisDecoderContext *context,ZydisDecodedInstruction *instruction,ZyanU8 *data)

{
  byte bVar1;
  ZyanU8 ZVar2;
  ZyanStatus ZVar3;
  byte bVar4;
  
  if ((*data & 0xfe) != 0xc4) {
    __assert_fail("(data[0] == 0xC4) || (data[0] == 0xC5)",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x1ca,
                  "ZyanStatus ZydisDecodeVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                 );
  }
  ZVar3 = 0x80200001;
  if (instruction->machine_mode != ZYDIS_MACHINE_MODE_MAX_VALUE) {
    *(byte *)&instruction->attributes = (byte)instruction->attributes | 0x10;
    if (*data == 0xc5) {
      if (instruction->length - 2 != (uint)(instruction->raw).field_3.xop.offset) {
        __assert_fail("instruction->raw.vex.offset == instruction->length - 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x1e2,
                      "ZyanStatus ZydisDecodeVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                     );
      }
      (instruction->raw).field_3.vex.size = '\x02';
      (instruction->raw).field_3.rex.W = data[1] >> 7;
      *(undefined4 *)((long)&(instruction->raw).field_3 + 1) = 0x10101;
      (instruction->raw).field_3.xop.vvvv = data[1] >> 3 & 0xf;
      (instruction->raw).field_3.xop.L = data[1] >> 2 & 1;
      (instruction->raw).field_3.xop.pp = data[1] & 3;
      bVar4 = 0;
    }
    else {
      if (*data != 0xc4) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x1ee,
                      "ZyanStatus ZydisDecodeVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                     );
      }
      if (instruction->length - 3 != (uint)(instruction->raw).field_3.xop.offset) {
        __assert_fail("instruction->raw.vex.offset == instruction->length - 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x1d6,
                      "ZyanStatus ZydisDecodeVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                     );
      }
      (instruction->raw).field_3.vex.size = '\x03';
      (instruction->raw).field_3.rex.W = data[1] >> 7;
      (instruction->raw).field_3.rex.R = data[1] >> 6 & 1;
      (instruction->raw).field_3.rex.X = data[1] >> 5 & 1;
      bVar1 = data[1];
      (instruction->raw).field_3.rex.B = bVar1 & 0x1f;
      bVar4 = data[2] >> 7;
      (instruction->raw).field_3.rex.offset = bVar4;
      (instruction->raw).field_3.xop.vvvv = data[2] >> 3 & 0xf;
      (instruction->raw).field_3.xop.L = data[2] >> 2 & 1;
      (instruction->raw).field_3.xop.pp = data[2] & 3;
      if (3 < (bVar1 & 0x1f)) {
        return 0x80200007;
      }
    }
    (context->vector_unified).W = bVar4;
    (context->vector_unified).R = ~(instruction->raw).field_3.rex.W & 1;
    (context->vector_unified).X = ~(instruction->raw).field_3.rex.R & 1;
    (context->vector_unified).B = ~(instruction->raw).field_3.rex.X & 1;
    ZVar2 = (instruction->raw).field_3.xop.L;
    (context->vector_unified).L = ZVar2;
    (context->vector_unified).LL = ZVar2;
    (context->vector_unified).vvvv = ~(instruction->raw).field_3.xop.vvvv & 0xf;
    ZVar3 = 0x100000;
  }
  return ZVar3;
}

Assistant:

static ZyanStatus ZydisDecodeVEX(ZydisDecoderContext* context,
    ZydisDecodedInstruction* instruction, const ZyanU8 data[3])
{
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT((data[0] == 0xC4) || (data[0] == 0xC5));

    if (instruction->machine_mode == ZYDIS_MACHINE_MODE_REAL_16)
    {
        // VEX is invalid in 16-bit real mode
        return ZYDIS_STATUS_DECODING_ERROR;
    }

    instruction->attributes |= ZYDIS_ATTRIB_HAS_VEX;
    switch (data[0])
    {
    case 0xC4:
        ZYAN_ASSERT(instruction->raw.vex.offset == instruction->length - 3);
        instruction->raw.vex.size    = 3;
        instruction->raw.vex.R       = (data[1] >> 7) & 0x01;
        instruction->raw.vex.X       = (data[1] >> 6) & 0x01;
        instruction->raw.vex.B       = (data[1] >> 5) & 0x01;
        instruction->raw.vex.m_mmmm  = (data[1] >> 0) & 0x1F;
        instruction->raw.vex.W       = (data[2] >> 7) & 0x01;
        instruction->raw.vex.vvvv    = (data[2] >> 3) & 0x0F;
        instruction->raw.vex.L       = (data[2] >> 2) & 0x01;
        instruction->raw.vex.pp      = (data[2] >> 0) & 0x03;
        break;
    case 0xC5:
        ZYAN_ASSERT(instruction->raw.vex.offset == instruction->length - 2);
        instruction->raw.vex.size    = 2;
        instruction->raw.vex.R       = (data[1] >> 7) & 0x01;
        instruction->raw.vex.X       = 1;
        instruction->raw.vex.B       = 1;
        instruction->raw.vex.m_mmmm  = 1;
        instruction->raw.vex.W       = 0;
        instruction->raw.vex.vvvv    = (data[1] >> 3) & 0x0F;
        instruction->raw.vex.L       = (data[1] >> 2) & 0x01;
        instruction->raw.vex.pp      = (data[1] >> 0) & 0x03;
        break;
    default:
        ZYAN_UNREACHABLE;
    }

    // Map 0 is only valid for some KNC instructions
#ifdef ZYDIS_DISABLE_KNC
    if ((instruction->raw.vex.m_mmmm == 0) || (instruction->raw.vex.m_mmmm > 0x03))
#else
    if (instruction->raw.vex.m_mmmm > 0x03)
#endif
    {
        // Invalid according to the intel documentation
        return ZYDIS_STATUS_INVALID_MAP;
    }

    // Update internal fields
    context->vector_unified.W    = instruction->raw.vex.W;
    context->vector_unified.R    = 0x01 & ~instruction->raw.vex.R;
    context->vector_unified.X    = 0x01 & ~instruction->raw.vex.X;
    context->vector_unified.B    = 0x01 & ~instruction->raw.vex.B;
    context->vector_unified.L    = instruction->raw.vex.L;
    context->vector_unified.LL   = instruction->raw.vex.L;
    context->vector_unified.vvvv = (0x0F & ~instruction->raw.vex.vvvv);

    return ZYAN_STATUS_SUCCESS;
}